

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtldurl.cpp
# Opt level: O0

bool __thiscall QPublicSuffixDatabase::loadFile(QPublicSuffixDatabase *this,QString *fileName)

{
  bool bVar1;
  pointer pQVar2;
  ulong uVar3;
  char *pcVar4;
  QByteArrayView *this_00;
  qsizetype qVar5;
  long lVar6;
  QFlags_conflict *pQVar7;
  QFlags_conflict *pQVar8;
  QString *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  uchar *mappedData;
  qint64 dataSize;
  qint64 fileSize;
  char version;
  QByteArray header;
  __single_object systemFile;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_10;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_9;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffc18;
  MemoryMapFlag in_stack_fffffffffffffc1c;
  undefined4 in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  QString *in_stack_fffffffffffffc28;
  QByteArrayView *in_stack_fffffffffffffc30;
  bool local_359;
  undefined8 local_358;
  undefined8 local_350;
  char local_348 [32];
  char local_328 [32];
  undefined1 local_308 [24];
  QString local_2f0 [2];
  char local_2c0 [32];
  undefined8 local_2a0;
  undefined8 local_298;
  char local_290 [40];
  char local_268 [32];
  char local_248 [39];
  char local_221;
  QString local_220 [2];
  char local_1f0 [32];
  undefined1 local_1d0 [24];
  char local_1b8 [48];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  char local_170 [32];
  QString local_150 [2];
  char local_120 [36];
  undefined4 local_fc;
  undefined8 local_f8;
  char local_d8 [32];
  undefined8 local_b8;
  ulong local_b0;
  undefined8 local_a8;
  ulong local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined8 local_88;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  undefined8 local_68;
  ulong local_60;
  undefined8 local_58;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcTld();
  anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x33ce9c);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
               in_stack_fffffffffffffc24,
               (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
               (char *)0x33ceb5);
    QtPrivate::asString(in_RSI);
    QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    pcVar4 = QByteArray::constData((QByteArray *)0x33cedc);
    QMessageLogger::debug(local_d8,"Loading publicsuffix file: %s",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x33cf02);
    local_10 = 0;
  }
  local_f8 = 0xaaaaaaaaaaaaaaaa;
  std::make_unique<QFile,QString_const&>(in_stack_fffffffffffffc28);
  pQVar2 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                     ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33cf3d);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc1c
            );
  uVar3 = (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,local_fc);
  if ((uVar3 & 1) == 0) {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    lcTld();
    anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_28);
      if (!bVar1) break;
      anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x33cfc4);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
                 in_stack_fffffffffffffc24,
                 (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (char *)0x33cfdd);
      std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33cfea);
      QIODevice::errorString();
      QtPrivate::asString(local_150);
      QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      pcVar4 = QByteArray::constData((QByteArray *)0x33d024);
      QMessageLogger::debug(local_120,"Failed to open publicsuffix file: %s",pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x33d04a);
      QString::~QString((QString *)0x33d057);
      local_20 = local_20 & 0xffffffffffffff00;
    }
    local_359 = false;
  }
  else {
    pQVar2 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                       ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d086);
    this_00 = (QByteArrayView *)(**(code **)(*(long *)pQVar2 + 0x80))();
    qVar5 = QByteArrayView::size(&loadFile::DafsaFileHeader);
    if ((long)this_00 < qVar5 + 2) {
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      lcTld();
      anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_38);
        if (!bVar1) break;
        anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x33d115);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
                   in_stack_fffffffffffffc24,
                   (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   (char *)0x33d12e);
        QMessageLogger::warning(local_170,"publicsuffix file is too small: %zu",this_00);
        local_30 = local_30 & 0xffffffffffffff00;
      }
      local_359 = false;
    }
    else {
      local_188 = 0xaaaaaaaaaaaaaaaa;
      local_180 = 0xaaaaaaaaaaaaaaaa;
      local_178 = 0xaaaaaaaaaaaaaaaa;
      std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d1a2);
      QByteArrayView::size(&loadFile::DafsaFileHeader);
      QIODevice::read((longlong)&local_188);
      QByteArrayView::QByteArrayView<QByteArray,_true>
                (in_stack_fffffffffffffc30,(QByteArray *)in_stack_fffffffffffffc28);
      bVar1 = ::operator!=((QByteArrayView *)
                           CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (QByteArrayView *)
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      if (bVar1) {
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_40 = 0xaaaaaaaaaaaaaaaa;
        lcTld();
        anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
                  );
        while( true ) {
          bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_48);
          if (!bVar1) break;
          anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x33d24d);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc24,
                     (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                     (char *)0x33d266);
          QByteArray::toHex((char)local_1d0);
          pcVar4 = QByteArray::constData((QByteArray *)0x33d28a);
          QMessageLogger::warning(local_1b8,"Invalid publicsuffix file header: %s",pcVar4);
          QByteArray::~QByteArray((QByteArray *)0x33d2b0);
          local_40 = local_40 & 0xffffffffffffff00;
        }
        local_359 = false;
      }
      else {
        pQVar2 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                           ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d2df);
        uVar3 = (**(code **)(*(long *)pQVar2 + 0x88))
                          (pQVar2,(undefined1 *)((long)&this_00[-1].m_data + 7));
        if ((uVar3 & 1) == 0) {
          local_58 = 0xaaaaaaaaaaaaaaaa;
          local_50 = 0xaaaaaaaaaaaaaaaa;
          lcTld();
          anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                     CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          while( true ) {
            bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                              ((QLoggingCategoryMacroHolder *)&local_58);
            if (!bVar1) break;
            anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x33d352);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28
                       ,in_stack_fffffffffffffc24,
                       (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                       (char *)0x33d36b);
            std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                      ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d378);
            QIODevice::errorString();
            QtPrivate::asString(local_220);
            QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
                           );
            pcVar4 = QByteArray::constData((QByteArray *)0x33d3b2);
            QMessageLogger::warning(local_1f0,"Failed to seek to the end of file: %s",pcVar4);
            QByteArray::~QByteArray((QByteArray *)0x33d3d8);
            QString::~QString((QString *)0x33d3e5);
            local_50 = local_50 & 0xffffffffffffff00;
          }
          local_359 = false;
        }
        else {
          local_221 = -0x56;
          pQVar2 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                             ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d41c);
          lVar6 = QIODevice::read((char *)pQVar2,(longlong)&local_221);
          if (lVar6 == 1) {
            if (local_221 == '\x01') {
              qVar5 = QByteArrayView::size(&loadFile::DafsaFileHeader);
              pQVar7 = (QFlags_conflict *)((long)this_00 + (-1 - qVar5));
              pQVar2 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                                 ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d5cd);
              qVar5 = QByteArrayView::size(&loadFile::DafsaFileHeader);
              QFlags<QFileDevice::MemoryMapFlag>::QFlags
                        ((QFlags<QFileDevice::MemoryMapFlag> *)
                         CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                         in_stack_fffffffffffffc1c);
              lVar6 = QFileDevice::map((longlong)pQVar2,qVar5,pQVar7);
              if (lVar6 == 0) {
                local_98 = 0xaaaaaaaaaaaaaaaa;
                local_90 = 0xaaaaaaaaaaaaaaaa;
                lcTld();
                anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                QLoggingCategoryMacroHolder
                          ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                           CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (QLoggingCategory *)
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                while( true ) {
                  bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                    ((QLoggingCategoryMacroHolder *)&local_98);
                  if (!bVar1) break;
                  anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x33d779);
                  QMessageLogger::QMessageLogger
                            ((QMessageLogger *)this_00,(char *)in_stack_fffffffffffffc28,
                             in_stack_fffffffffffffc24,
                             (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                             (char *)0x33d792);
                  std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                            ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d79f);
                  QIODevice::errorString();
                  QtPrivate::asString(local_2f0);
                  QString::toUtf8((QString *)
                                  CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                  pcVar4 = QByteArray::constData((QByteArray *)0x33d7d9);
                  QMessageLogger::debug(local_2c0,"Failed to map publicsuffix file: %s",pcVar4);
                  QByteArray::~QByteArray((QByteArray *)0x33d7ff);
                  QString::~QString((QString *)0x33d80c);
                  local_90 = local_90 & 0xffffffffffffff00;
                }
                pQVar2 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                                   ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d826);
                qVar5 = QByteArrayView::size(&loadFile::DafsaFileHeader);
                (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,qVar5);
                std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                          ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d855);
                QIODevice::read((longlong)local_308);
                QByteArray::operator=
                          ((QByteArray *)
                           CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (QByteArray *)
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                QByteArray::~QByteArray((QByteArray *)0x33d88d);
                pQVar8 = (QFlags_conflict *)QByteArray::size((QByteArray *)(in_RDI + 3));
                if (pQVar8 == pQVar7) {
                  local_b8 = 0xaaaaaaaaaaaaaaaa;
                  local_b0 = 0xaaaaaaaaaaaaaaaa;
                  lcTld();
                  anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                  QLoggingCategoryMacroHolder
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                             (QLoggingCategory *)
                             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                  while( true ) {
                    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                            operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_b8);
                    if (!bVar1) break;
                    anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x33d9a8);
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)this_00,(char *)pQVar2,in_stack_fffffffffffffc24,
                               (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
                               ,(char *)0x33d9c1);
                    QMessageLogger::debug(local_348,"Using system publicsuffix data");
                    local_b0 = local_b0 & 0xffffffffffffff00;
                  }
                  QByteArrayView::QByteArrayView<QByteArray,_true>(this_00,(QByteArray *)pQVar2);
                  *in_RDI = local_358;
                  in_RDI[1] = local_350;
                  local_359 = true;
                }
                else {
                  local_a8 = 0xaaaaaaaaaaaaaaaa;
                  local_a0 = 0xaaaaaaaaaaaaaaaa;
                  lcTld();
                  anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                  QLoggingCategoryMacroHolder
                            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                             (QLoggingCategory *)
                             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                  while( true ) {
                    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                            operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_a8);
                    if (!bVar1) break;
                    anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x33d8f9);
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)this_00,(char *)pQVar2,in_stack_fffffffffffffc24,
                               (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
                               ,(char *)0x33d912);
                    QMessageLogger::warning(local_328,"Failed to read publicsuffix file");
                    local_a0 = local_a0 & 0xffffffffffffff00;
                  }
                  QByteArray::clear();
                  local_359 = false;
                }
              }
              else {
                local_88 = 0xaaaaaaaaaaaaaaaa;
                local_80 = 0xaaaaaaaaaaaaaaaa;
                lcTld();
                anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                QLoggingCategoryMacroHolder
                          ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                           CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (QLoggingCategory *)
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                while( true ) {
                  bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                    ((QLoggingCategoryMacroHolder *)&local_88);
                  if (!bVar1) break;
                  anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x33d67b);
                  QMessageLogger::QMessageLogger
                            ((QMessageLogger *)this_00,(char *)in_stack_fffffffffffffc28,
                             in_stack_fffffffffffffc24,
                             (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                             (char *)0x33d694);
                  QMessageLogger::debug(local_290,"Using mapped system publicsuffix data");
                  local_80 = local_80 & 0xffffffffffffff00;
                }
                pQVar2 = std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator->
                                   ((unique_ptr<QFile,_std::default_delete<QFile>_> *)0x33d6c1);
                (**(code **)(*(long *)pQVar2 + 0x70))();
                QByteArrayView::QByteArrayView<unsigned_char,_true>
                          (this_00,(uchar *)in_stack_fffffffffffffc28,
                           CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
                *in_RDI = local_2a0;
                in_RDI[1] = local_298;
                std::unique_ptr<QFile,_std::default_delete<QFile>_>::operator=
                          ((unique_ptr<QFile,_std::default_delete<QFile>_> *)
                           CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (unique_ptr<QFile,_std::default_delete<QFile>_> *)
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                local_359 = true;
              }
            }
            else {
              local_78 = 0xaaaaaaaaaaaaaaaa;
              local_70 = 0xaaaaaaaaaaaaaaaa;
              lcTld();
              anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
              QLoggingCategoryMacroHolder
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                         CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                         (QLoggingCategory *)
                         CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
              while( true ) {
                bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                  ((QLoggingCategoryMacroHolder *)&local_78);
                if (!bVar1) break;
                anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x33d540);
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_fffffffffffffc30,
                           (char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                           (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                           (char *)0x33d559);
                QMessageLogger::warning
                          (local_268,"Unsupported publicsuffix version: %d",
                           (ulong)(uint)(int)local_221);
                local_70 = local_70 & 0xffffffffffffff00;
              }
              local_359 = false;
            }
          }
          else {
            local_68 = 0xaaaaaaaaaaaaaaaa;
            local_60 = 0xaaaaaaaaaaaaaaaa;
            lcTld();
            anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                       CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                       (QLoggingCategory *)
                       CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
            while( true ) {
              bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_68);
              if (!bVar1) break;
              anon_unknown.dwarf_834bd5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x33d48e);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffc30,
                         (char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                         (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                         (char *)0x33d4a7);
              QMessageLogger::warning(local_248,"Failed to read publicsuffix version");
              local_60 = local_60 & 0xffffffffffffff00;
            }
            local_359 = false;
          }
        }
      }
      QByteArray::~QByteArray((QByteArray *)0x33da30);
    }
  }
  std::unique_ptr<QFile,_std::default_delete<QFile>_>::~unique_ptr
            ((unique_ptr<QFile,_std::default_delete<QFile>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_359;
  }
  __stack_chk_fail();
}

Assistant:

bool QPublicSuffixDatabase::loadFile(const QString &fileName)
{
    static const QByteArrayView DafsaFileHeader = ".DAFSA@PSL_0   \n";

    qCDebug(lcTld, "Loading publicsuffix file: %s", qUtf8Printable(fileName));

    auto systemFile = std::make_unique<QFile>(fileName);

    if (!systemFile->open(QIODevice::ReadOnly)) {
        qCDebug(lcTld, "Failed to open publicsuffix file: %s",
                qUtf8Printable(systemFile->errorString()));
        return false;
    }

    auto fileSize = systemFile->size();
    // Check if there is enough data for header, version byte and some data
    if (fileSize < DafsaFileHeader.size() + 2) {
        qCWarning(lcTld, "publicsuffix file is too small: %zu", std::size_t(fileSize));
        return false;
    }

    auto header = systemFile->read(DafsaFileHeader.size());
    if (header != DafsaFileHeader) {
        qCWarning(lcTld, "Invalid publicsuffix file header: %s", header.toHex().constData());
        return false;
    }

    // Check if the file is UTF-8 compatible
    if (!systemFile->seek(fileSize - 1)) {
        qCWarning(lcTld, "Failed to seek to the end of file: %s",
                  qUtf8Printable(systemFile->errorString()));
        return false;
    }

    char version;
    if (systemFile->read(&version, 1) != 1) {
        qCWarning(lcTld, "Failed to read publicsuffix version");
        return false;
    }

    if (version != 0x01) {
        qCWarning(lcTld, "Unsupported publicsuffix version: %d", int(version));
        return false;
    }

    const auto dataSize = fileSize - DafsaFileHeader.size() - 1;
    // Try to map the file first
    auto mappedData = systemFile->map(DafsaFileHeader.size(), dataSize);
    if (mappedData) {
        qCDebug(lcTld, "Using mapped system publicsuffix data");
        systemFile->close();
        m_data = QByteArrayView(mappedData, dataSize);
        m_dev = std::move(systemFile);
        return true;
    }

    qCDebug(lcTld, "Failed to map publicsuffix file: %s",
            qUtf8Printable(systemFile->errorString()));

    systemFile->seek(DafsaFileHeader.size());
    m_storage = systemFile->read(dataSize);
    if (m_storage.size() != dataSize) {
        qCWarning(lcTld, "Failed to read publicsuffix file");
        m_storage.clear();
        return false;
    }

    qCDebug(lcTld, "Using system publicsuffix data");
    m_data = m_storage;

    return true;
}